

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive.cpp
# Opt level: O0

void __thiscall
SerializeArchiveVectorWriter_WriteAnInt_Test::SerializeArchiveVectorWriter_WriteAnInt_Test
          (SerializeArchiveVectorWriter_WriteAnInt_Test *this)

{
  SerializeArchiveVectorWriter_WriteAnInt_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__SerializeArchiveVectorWriter_WriteAnInt_Test_00231ff8;
  return;
}

Assistant:

TEST (SerializeArchiveVectorWriter, WriteAnInt) {
    std::vector<std::uint8_t> bytes;
    bytes.reserve (sizeof (int));
    pstore::serialize::archive::vector_writer writer (bytes);
    writer.put (42);

    // Check that we wrote sizeof (int) bytes.
    auto begin = std::begin (writer);
    auto end = std::end (writer);

    using difference_type = std::iterator_traits<decltype (begin)>::difference_type;
    ASSERT_EQ (difference_type{sizeof (int)}, std::distance (begin, end));
    EXPECT_EQ (bytes.size (), writer.bytes_consumed ());
    EXPECT_EQ (bytes.size (), writer.bytes_produced ());

    // Now coax the value back out of the byte array that the vector_writer has accumulated.
    std::uint8_t content[sizeof (int)];
    std::copy (begin, end, content);
    int value;
    std::memcpy (&value, content, sizeof (value));
    EXPECT_EQ (42, value);
}